

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O1

FT_UInt16 FT_Stream_GetUShort(FT_Stream stream)

{
  ushort uVar1;
  ushort *puVar2;
  
  puVar2 = (ushort *)stream->cursor;
  if ((uchar *)((long)puVar2 + 1U) < stream->limit) {
    uVar1 = *puVar2;
    puVar2 = puVar2 + 1;
    uVar1 = uVar1 << 8 | uVar1 >> 8;
  }
  else {
    uVar1 = 0;
  }
  stream->cursor = (uchar *)puVar2;
  return uVar1;
}

Assistant:

FT_BASE_DEF( FT_UInt16 )
  FT_Stream_GetUShort( FT_Stream  stream )
  {
    FT_Byte*   p;
    FT_UInt16  result;


    FT_ASSERT( stream && stream->cursor );

    result         = 0;
    p              = stream->cursor;
    if ( p + 1 < stream->limit )
      result       = FT_NEXT_USHORT( p );
    stream->cursor = p;

    return result;
  }